

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O3

int PHF::init<std::__cxx11::string,true>
              (phf *phf,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
              size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  pointer pcVar3;
  long lVar4;
  ulong uVar5;
  byte bVar6;
  ulong uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> k_03;
  string *psVar8;
  void *pvVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  ulong uVar12;
  string *__ptr;
  uint *puVar13;
  ulong uVar14;
  string *psVar15;
  ulong uVar16;
  size_t sVar17;
  string *psVar18;
  ulong uVar19;
  uint uVar20;
  undefined8 in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 *local_118;
  long local_110;
  undefined1 local_108 [16];
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 *local_d8;
  long local_d0;
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  ulong local_98;
  uint32_t *local_90;
  size_t local_88;
  string *local_80;
  void *local_78;
  size_t local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  void *local_48;
  string *local_40;
  phf_seed_t local_38;
  uint local_34;
  
  local_48 = (void *)(n + (n == 0));
  uVar14 = l + (l == 0);
  sVar17 = 100;
  if (a < 100) {
    sVar17 = a;
  }
  phf->nodiv = true;
  if (local_48 <= uVar14) {
    uVar14 = (ulong)local_48;
  }
  uVar14 = (ulong)local_48 / uVar14 - 1;
  uVar14 = uVar14 >> 1 | uVar14;
  uVar14 = uVar14 >> 2 | uVar14;
  uVar14 = uVar14 >> 4 | uVar14;
  uVar14 = uVar14 >> 8 | uVar14;
  uVar14 = uVar14 >> 0x10 | uVar14;
  uVar12 = (ulong)((long)local_48 * 100) / (sVar17 + (sVar17 == 0)) - 1;
  uVar12 = uVar12 >> 1 | uVar12;
  uVar12 = uVar12 >> 2 | uVar12;
  uVar12 = uVar12 >> 4 | uVar12;
  uVar12 = uVar12 >> 8 | uVar12;
  uVar12 = uVar12 >> 0x10 | uVar12;
  uVar12 = uVar12 >> 0x20 | uVar12;
  local_88 = uVar12 + 1;
  local_70 = (uVar14 >> 0x20 | uVar14) + 1;
  if (local_70 == 0) {
    return 0x22;
  }
  if (local_88 == 0) {
    return 0x22;
  }
  local_38 = seed;
  __ptr = (string *)calloc((size_t)local_48,0x30);
  if ((__ptr == (string *)0x0) || (local_78 = calloc(local_70,8), local_78 == (void *)0x0)) {
    local_48 = (void *)0x0;
    local_78 = (void *)0x0;
  }
  else {
    local_80 = __ptr;
    local_40 = (string *)n;
    if (n != 0) {
      local_34 = (int)local_70 - 1;
      do {
        local_118 = local_108;
        pcVar3 = (k->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_118,pcVar3,pcVar3 + k->_M_string_length);
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_68,local_118,local_118 + local_110);
        k_00._M_string_length = in_stack_fffffffffffffed0;
        k_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
        k_00.field_2._M_allocated_capacity = in_stack_fffffffffffffed8;
        k_00.field_2._8_8_ = phf;
        uVar10 = phf_g<std::__cxx11::string>(k_00,(uint32_t)local_68[0]);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0]);
        }
        if (local_118 != local_108) {
          operator_delete(local_118);
        }
        uVar20 = uVar10 & local_34;
        std::__cxx11::string::_M_assign(__ptr);
        *(uint *)(__ptr + 0x20) = uVar20;
        plVar1 = (long *)((long)local_78 + (ulong)uVar20 * 8);
        *plVar1 = *plVar1 + 1;
        *(void **)(__ptr + 0x28) = (void *)((long)local_78 + (ulong)uVar20 * 8);
        __ptr = __ptr + 0x30;
        k = k + 1;
        n = n - 1;
      } while (n != 0);
    }
    __ptr = local_80;
    qsort(local_80,(size_t)local_48,0x30,phf_keycmp<std::__cxx11::string>);
    uVar14 = uVar12 + 0x40 >> 6;
    local_48 = calloc(uVar14 * 2,8);
    if (local_48 == (void *)0x0) {
      local_48 = (void *)0x0;
    }
    else {
      local_90 = (uint32_t *)calloc(local_70,4);
      pvVar9 = local_48;
      if (local_90 != (uint32_t *)0x0) {
        local_98 = 0;
        if ((long)local_40 < 1) {
          uVar12 = 0;
        }
        else {
          psVar15 = __ptr + (long)local_40 * 0x30;
          local_34 = (int)local_88 - 1;
          uVar12 = 0;
          do {
            lVar4 = **(long **)(__ptr + 0x28);
            if (lVar4 == 0) break;
            psVar18 = __ptr + lVar4 * 0x30;
            uVar19 = 1;
            while (uVar10 = (uint32_t)uVar19, local_40 = __ptr, psVar8 = __ptr, 0 < lVar4) {
              while( true ) {
                local_f8 = local_e8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f8,*(long *)__ptr,*(long *)(__ptr + 8) + *(long *)__ptr)
                ;
                local_68[0] = local_58;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_68,local_f8,local_f8 + local_f0);
                k_01._M_string_length = uVar12;
                k_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
                k_01.field_2._M_allocated_capacity = (size_type)psVar15;
                k_01.field_2._8_8_ = phf;
                uVar11 = phf_f<std::__cxx11::string>(uVar10,k_01,(uint32_t)local_68[0]);
                if (local_68[0] != local_58) {
                  operator_delete(local_68[0]);
                }
                if (local_f8 != local_e8) {
                  operator_delete(local_f8);
                }
                uVar20 = uVar11 & local_34;
                uVar7 = (ulong)(uVar20 >> 6);
                uVar16 = 1L << ((byte)uVar20 & 0x3f);
                psVar8 = local_40;
                if (((*(ulong *)((long)local_48 + uVar7 * 8) >> ((ulong)uVar20 & 0x3f) & 1) != 0) ||
                   (uVar5 = *(ulong *)((long)pvVar9 + uVar7 * 8 + uVar14 * 8), (uVar5 & uVar16) != 0
                   )) break;
                *(ulong *)((long)pvVar9 + uVar7 * 8 + uVar14 * 8) = uVar5 | uVar16;
                __ptr = __ptr + 0x30;
                if (psVar18 <= __ptr) goto joined_r0x00116dc5;
              }
              for (; psVar8 < psVar18; psVar8 = psVar8 + 0x30) {
                local_d8 = local_c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,*(long *)psVar8,
                           *(long *)(psVar8 + 8) + *(long *)psVar8);
                local_68[0] = local_58;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_68,local_d8,local_d8 + local_d0);
                k_02._M_string_length = uVar12;
                k_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
                k_02.field_2._M_allocated_capacity = (size_type)psVar15;
                k_02.field_2._8_8_ = phf;
                uVar11 = phf_f<std::__cxx11::string>(uVar10,k_02,(uint32_t)local_68[0]);
                if (local_68[0] != local_58) {
                  operator_delete(local_68[0]);
                }
                if (local_d8 != local_c8) {
                  operator_delete(local_d8);
                }
                bVar6 = (byte)(uVar11 & local_34) & 0x3f;
                puVar2 = (ulong *)((long)pvVar9 + (ulong)((uVar11 & local_34) >> 6) * 8 + uVar14 * 8
                                  );
                *puVar2 = *puVar2 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
              }
              uVar19 = uVar19 + 1;
              lVar4 = **(long **)(local_40 + 0x28);
              psVar18 = local_40 + lVar4 * 0x30;
              __ptr = local_40;
            }
joined_r0x00116dc5:
            for (; psVar8 < psVar18; psVar8 = psVar8 + 0x30) {
              local_b8 = local_a8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,*(long *)psVar8,*(long *)(psVar8 + 8) + *(long *)psVar8
                        );
              local_68[0] = local_58;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_68,local_b8,local_b8 + local_b0);
              k_03._M_string_length = uVar12;
              k_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8;
              k_03.field_2._M_allocated_capacity = (size_type)psVar15;
              k_03.field_2._8_8_ = phf;
              uVar11 = phf_f<std::__cxx11::string>(uVar10,k_03,(uint32_t)local_68[0]);
              if (local_68[0] != local_58) {
                operator_delete(local_68[0]);
              }
              if (local_b8 != local_a8) {
                operator_delete(local_b8);
              }
              puVar2 = (ulong *)((long)local_48 + (ulong)((uVar11 & local_34) >> 6) * 8);
              *puVar2 = *puVar2 | 1L << ((byte)(uVar11 & local_34) & 0x3f);
            }
            uVar12 = uVar12 & 0xffffffff;
            if (uVar12 < uVar19) {
              uVar12 = uVar19;
            }
            local_90[*(uint *)(local_40 + 0x20)] = uVar10;
            __ptr = local_40 + **(long **)(local_40 + 0x28) * 0x30;
          } while (__ptr < psVar15);
          uVar12 = uVar12 & 0xffffffff;
          __ptr = local_80;
        }
        phf->seed = local_38;
        phf->r = local_70;
        phf->m = local_88;
        phf->g = local_90;
        phf->d_max = uVar12;
        phf->g_op = PHF_G_UINT32_BAND_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00116ee4;
      }
    }
  }
  puVar13 = (uint *)__errno_location();
  local_98 = (ulong)*puVar13;
LAB_00116ee4:
  free(local_48);
  free(local_78);
  free(__ptr);
  return (int)local_98;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}